

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_matrix.cpp
# Opt level: O0

bool __thiscall ExtendedMatrix::SwapColumns(ExtendedMatrix *this,int first_column,int second_column)

{
  int iVar1;
  bool local_1d;
  bool result;
  int m;
  int second_column_local;
  int first_column_local;
  ExtendedMatrix *this_local;
  
  iVar1 = Matrix::GetNumColumns(&this->main_);
  local_1d = false;
  if ((first_column < iVar1) && (second_column < iVar1)) {
    local_1d = Matrix::SwapColumns(&this->main_,first_column,second_column);
    if (local_1d) {
      Permutation::Transposition(&this->main_column_permutation_,first_column,second_column);
    }
  }
  else if ((iVar1 <= first_column) &&
          ((iVar1 <= second_column &&
           (local_1d = Matrix::SwapColumns(&this->extension_,first_column - iVar1,
                                           second_column - iVar1), local_1d)))) {
    Permutation::Transposition
              (&this->extension_column_permutation_,first_column - iVar1,second_column - iVar1);
  }
  return local_1d;
}

Assistant:

bool ExtendedMatrix::SwapColumns(int first_column, int second_column) {
  int m = main_.GetNumColumns();
  bool result = false;
  if (first_column < m && second_column < m) {
    result = main_.SwapColumns(first_column, second_column);
    if (result) {
      main_column_permutation_.Transposition(first_column, second_column);
    }
  } else if (first_column >= m && second_column >= m) {
    result = extension_.SwapColumns(first_column - m, second_column - m);
    if (result) {
      extension_column_permutation_.Transposition(first_column - m, second_column - m);
    }
  }

  return result;
}